

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O3

uint xSAT_SolverClaNew(xSAT_Solver_t *s,Vec_Int_t *vLits,int fLearnt)

{
  iword *piVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  uint *puVar5;
  uint Entry;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  xSAT_Watcher_t *pxVar10;
  Vec_Int_t *pVVar11;
  xSAT_VecWatchList_t *pxVar12;
  int newsize;
  xSAT_WatchList_t *pxVar13;
  xSAT_Watcher_t xVar14;
  xSAT_Watcher_t xVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  xSAT_Watcher_t xVar19;
  uint *puVar20;
  
  if (vLits->nSize < 2) {
    __assert_fail("Vec_IntSize( vLits ) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatSolver.c"
                  ,0x115,"unsigned int xSAT_SolverClaNew(xSAT_Solver_t *, Vec_Int_t *, int)");
  }
  if (1 < (uint)fLearnt) {
    __assert_fail("fLearnt == 0 || fLearnt == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatSolver.c"
                  ,0x116,"unsigned int xSAT_SolverClaNew(xSAT_Solver_t *, Vec_Int_t *, int)");
  }
  Entry = xSAT_MemAppend(s->pMemory,fLearnt + vLits->nSize + 3);
  if (Entry == 0xffffffff) {
    puVar20 = (uint *)0x0;
  }
  else {
    puVar20 = s->pMemory->pData + (int)Entry;
  }
  *puVar20 = (*puVar20 & 0xfffffff0) + fLearnt * 8 | fLearnt;
  uVar17 = vLits->nSize;
  puVar20[1] = uVar17;
  memcpy(puVar20 + 2,vLits->pArray,(long)(int)uVar17 << 2);
  if (fLearnt == 0) {
    Vec_IntPush(s->vClauses,Entry);
    piVar1 = &(s->Stats).nClauseLits;
    *piVar1 = *piVar1 + (long)vLits->nSize;
  }
  else {
    Vec_IntPush(s->vLearnts,Entry);
    s->nStamp = s->nStamp + 1;
    iVar8 = vLits->nSize;
    if (iVar8 < 1) {
      uVar17 = 0;
    }
    else {
      pVVar11 = s->vLevels;
      piVar3 = vLits->pArray;
      lVar16 = 0;
      iVar6 = 0;
      do {
        uVar17 = piVar3[lVar16] >> 1;
        if (((int)uVar17 < 0) || (pVVar11->nSize <= (int)uVar17)) {
LAB_008f32f7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = pVVar11->pArray[uVar17];
        lVar18 = (long)iVar2;
        if ((lVar18 < 0) || (s->vStamp->nSize <= iVar2)) goto LAB_008f32f7;
        piVar4 = s->vStamp->pArray;
        if (piVar4[lVar18] != s->nStamp) {
          piVar4[lVar18] = s->nStamp;
          iVar6 = iVar6 + 1;
          iVar8 = vLits->nSize;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < iVar8);
      uVar17 = iVar6 << 4;
    }
    *puVar20 = *puVar20 & 0xf | uVar17;
    puVar20[(long)(int)puVar20[1] + 2] = 0;
    piVar1 = &(s->Stats).nLearntLits;
    *piVar1 = *piVar1 + (long)vLits->nSize;
    puVar20[(long)(int)puVar20[1] + 2] = puVar20[(long)(int)puVar20[1] + 2] + s->nClaActInc;
    if ((int)puVar20[(long)(int)puVar20[1] + 2] < 0) {
      pVVar11 = s->vLearnts;
      if (0 < pVVar11->nSize) {
        lVar16 = 0;
        do {
          puVar5 = s->pMemory->pData;
          puVar5 = puVar5 + (long)pVVar11->pArray[lVar16] +
                            (long)(int)puVar5[(long)pVVar11->pArray[lVar16] + 1] + 2;
          *puVar5 = *puVar5 >> 0xe;
          lVar16 = lVar16 + 1;
          pVVar11 = s->vLearnts;
        } while (lVar16 < pVVar11->nSize);
      }
      iVar6 = s->nClaActInc >> 0xe;
      iVar8 = 0x400;
      if (0x400 < iVar6) {
        iVar8 = iVar6;
      }
      s->nClaActInc = iVar8;
    }
  }
  uVar17 = puVar20[2];
  uVar9 = (long)(int)uVar17 ^ 1;
  iVar8 = (int)uVar9;
  if (vLits->nSize == 2) {
    pxVar12 = s->vBinWatches;
    if (pxVar12->nCap <= iVar8) goto LAB_008f3316;
    if (pxVar12->nSize <= iVar8) goto LAB_008f3335;
    if (pxVar12->pArray == (xSAT_WatchList_t *)0x0) goto LAB_008f3354;
    pxVar13 = pxVar12->pArray + uVar9;
    xVar14.Blocker = puVar20[3];
    xVar14.CRef = Entry;
    uVar7 = pxVar13->nSize;
    if (uVar7 == pxVar13->nCap) {
      uVar9 = 4;
      if (3 < (int)uVar7) {
        uVar9 = (ulong)((uVar7 >> 1) * 3);
      }
      if (pxVar13->pArray == (xSAT_Watcher_t *)0x0) {
        pxVar10 = (xSAT_Watcher_t *)malloc(uVar9 * 8);
      }
      else {
        pxVar10 = (xSAT_Watcher_t *)realloc(pxVar13->pArray,uVar9 * 8);
      }
      pxVar13->pArray = pxVar10;
      if (pxVar10 == (xSAT_Watcher_t *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)pxVar13->nCap * 9.5367431640625e-07,(double)(int)uVar9 * 9.5367431640625e-07)
        ;
        fflush(_stdout);
      }
      pxVar13->nCap = (int)uVar9;
      uVar7 = pxVar13->nSize;
    }
    pxVar13->nSize = uVar7 + 1;
    pxVar13->pArray[(int)uVar7] = xVar14;
    pxVar12 = s->vBinWatches;
  }
  else {
    pxVar12 = s->vWatches;
    if (pxVar12->nCap <= iVar8) goto LAB_008f3316;
    if (pxVar12->nSize <= iVar8) goto LAB_008f3335;
    if (pxVar12->pArray == (xSAT_WatchList_t *)0x0) goto LAB_008f3354;
    pxVar13 = pxVar12->pArray + iVar8;
    xVar15.Blocker = puVar20[3];
    xVar15.CRef = Entry;
    uVar7 = pxVar13->nSize;
    if (uVar7 == pxVar13->nCap) {
      uVar9 = 4;
      if (3 < (int)uVar7) {
        uVar9 = (ulong)((uVar7 >> 1) * 3);
      }
      if (pxVar13->pArray == (xSAT_Watcher_t *)0x0) {
        pxVar10 = (xSAT_Watcher_t *)malloc(uVar9 * 8);
      }
      else {
        pxVar10 = (xSAT_Watcher_t *)realloc(pxVar13->pArray,uVar9 * 8);
      }
      pxVar13->pArray = pxVar10;
      if (pxVar10 == (xSAT_Watcher_t *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)pxVar13->nCap * 9.5367431640625e-07,(double)(int)uVar9 * 9.5367431640625e-07)
        ;
        fflush(_stdout);
      }
      pxVar13->nCap = (int)uVar9;
      uVar7 = pxVar13->nSize;
    }
    pxVar13->nSize = uVar7 + 1;
    pxVar13->pArray[(int)uVar7] = xVar15;
    pxVar12 = s->vWatches;
  }
  iVar8 = (int)((long)(int)puVar20[3] ^ 1U);
  if (iVar8 < pxVar12->nCap) {
    if (iVar8 < pxVar12->nSize) {
      if (pxVar12->pArray != (xSAT_WatchList_t *)0x0) {
        pxVar13 = pxVar12->pArray + ((long)(int)puVar20[3] ^ 1U);
        xVar19.Blocker = uVar17;
        xVar19.CRef = Entry;
        uVar17 = pxVar13->nSize;
        if (uVar17 == pxVar13->nCap) {
          uVar9 = 4;
          if (3 < (int)uVar17) {
            uVar9 = (ulong)((uVar17 >> 1) * 3);
          }
          if (pxVar13->pArray == (xSAT_Watcher_t *)0x0) {
            pxVar10 = (xSAT_Watcher_t *)malloc(uVar9 * 8);
          }
          else {
            pxVar10 = (xSAT_Watcher_t *)realloc(pxVar13->pArray,uVar9 * 8);
          }
          pxVar13->pArray = pxVar10;
          if (pxVar10 == (xSAT_Watcher_t *)0x0) {
            printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                   (double)pxVar13->nCap * 9.5367431640625e-07,
                   (double)(int)uVar9 * 9.5367431640625e-07);
            fflush(_stdout);
          }
          pxVar13->nCap = (int)uVar9;
          uVar17 = pxVar13->nSize;
        }
        pxVar13->nSize = uVar17 + 1;
        pxVar13->pArray[(int)uVar17] = xVar19;
        return Entry;
      }
LAB_008f3354:
      __assert_fail("v",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                    ,0x78,"void xSAT_WatchListPush(xSAT_WatchList_t *, xSAT_Watcher_t)");
    }
LAB_008f3335:
    __assert_fail("iEntry < v->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                  ,0x107,"xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)");
  }
LAB_008f3316:
  __assert_fail("iEntry < v->nCap",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                ,0x106,"xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)");
}

Assistant:

unsigned xSAT_SolverClaNew( xSAT_Solver_t * s, Vec_Int_t * vLits , int fLearnt )
{
    unsigned CRef;
    xSAT_Clause_t * pCla;
    xSAT_Watcher_t w1;
    xSAT_Watcher_t w2;
    unsigned nWords;

    assert( Vec_IntSize( vLits ) > 1);
    assert( fLearnt == 0 || fLearnt == 1 );

    nWords = 3 + fLearnt + Vec_IntSize( vLits );
    CRef = xSAT_MemAppend( s->pMemory, nWords );
    pCla = xSAT_SolverReadClause( s, CRef );
    pCla->fLearnt = fLearnt;
    pCla->fMark = 0;
    pCla->fReallocd = 0;
    pCla->fCanBeDel = fLearnt;
    pCla->nSize = Vec_IntSize( vLits );
    memcpy( &( pCla->pData[0].Lit ), Vec_IntArray( vLits ), sizeof( int ) * Vec_IntSize( vLits ) );

    if ( fLearnt )
    {
        Vec_IntPush( s->vLearnts, CRef );
        pCla->nLBD = xSAT_SolverClaCalcLBD2( s, vLits );
        pCla->pData[pCla->nSize].Act = 0;
        s->Stats.nLearntLits += Vec_IntSize( vLits );
        xSAT_SolverClaActBump(s, pCla);
    }
    else
    {
        Vec_IntPush( s->vClauses, CRef );
        s->Stats.nClauseLits += Vec_IntSize( vLits );
    }

    w1.CRef = CRef;
    w2.CRef = CRef;
    w1.Blocker = pCla->pData[1].Lit;
    w2.Blocker = pCla->pData[0].Lit;

    if ( Vec_IntSize( vLits ) == 2 )
    {
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vBinWatches, xSAT_NegLit( pCla->pData[0].Lit ) ), w1 );
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vBinWatches, xSAT_NegLit( pCla->pData[1].Lit ) ), w2 );
    }
    else
    {
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit( pCla->pData[0].Lit ) ), w1 );
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit( pCla->pData[1].Lit ) ), w2 );
    }
    return CRef;
}